

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_network.hxx
# Opt level: O0

void __thiscall
nuraft::FakeNetwork::ReqPkg::ReqPkg(ReqPkg *this,ptr<req_msg> *_req,rpc_handler *_when_done)

{
  shared_ptr<nuraft::req_msg> *in_RDI;
  shared_ptr<nuraft::req_msg> *in_stack_ffffffffffffffc8;
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  *in_stack_ffffffffffffffd8;
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  *in_stack_ffffffffffffffe0;
  
  std::shared_ptr<nuraft::req_msg>::shared_ptr(in_RDI,in_stack_ffffffffffffffc8);
  std::
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
  function(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

ReqPkg(ptr<req_msg>& _req, rpc_handler& _when_done)
            : req(_req), whenDone(_when_done)
            {}